

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O1

bool llvm::ARM::getHWDivFeatures
               (uint HWDivKind,vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *Features)

{
  pointer *ppSVar1;
  iterator iVar2;
  StringRef local_20;
  
  if (HWDivKind != 0) {
    if ((HWDivKind & 0x20) == 0) {
      local_20.Data = "-hwdiv-arm";
    }
    else {
      local_20.Data = "+hwdiv-arm";
    }
    local_20.Length = 10;
    iVar2._M_current =
         (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
      _M_realloc_insert<llvm::StringRef>(Features,iVar2,&local_20);
    }
    else {
      (iVar2._M_current)->Data = local_20.Data;
      (iVar2._M_current)->Length = 10;
      ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
    if ((HWDivKind & 0x10) == 0) {
      local_20.Data = "-hwdiv";
    }
    else {
      local_20.Data = "+hwdiv";
    }
    local_20.Length = 6;
    iVar2._M_current =
         (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
      _M_realloc_insert<llvm::StringRef>(Features,iVar2,&local_20);
    }
    else {
      (iVar2._M_current)->Data = local_20.Data;
      (iVar2._M_current)->Length = 6;
      ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
  }
  return HWDivKind != 0;
}

Assistant:

bool llvm::ARM::getHWDivFeatures(unsigned HWDivKind,
                                 std::vector<StringRef> &Features) {

  if (HWDivKind == ARM::AEK_INVALID)
    return false;

  if (HWDivKind & ARM::AEK_HWDIVARM)
    Features.push_back("+hwdiv-arm");
  else
    Features.push_back("-hwdiv-arm");

  if (HWDivKind & ARM::AEK_HWDIVTHUMB)
    Features.push_back("+hwdiv");
  else
    Features.push_back("-hwdiv");

  return true;
}